

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

double mpt::log(double __x)

{
  char in_AL;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  double dVar1;
  double extraout_XMM0_Qa;
  undefined1 local_108 [48];
  double local_d8;
  undefined1 local_48 [4];
  int ret;
  va_list va;
  char *fmt_local;
  int type_local;
  char *fcn_local;
  convertable *dest_local;
  
  if (in_AL != '\0') {
    local_d8 = __x;
  }
  if (in_RCX != (char *)0x0) {
    va[0].overflow_arg_area = local_108;
    va[0]._0_8_ = &stack0x00000008;
    ret = 0x30;
    local_48 = (undefined1  [4])0x20;
  }
  if (in_RDI == 0) {
    print_message(in_RSI,in_EDX,in_RCX,(__va_list_tag *)local_48);
    dVar1 = extraout_XMM0_Qa;
  }
  else {
    dVar1 = (double)mpt_convertable_vlog(in_RDI,in_RSI,in_EDX | 0x800,in_RCX,local_48);
  }
  return dVar1;
}

Assistant:

int log(convertable *dest, const char *fcn, int type, const char *fmt, ...)
{
	va_list va;
	if (fmt) va_start(va, fmt);
	int ret;
	if (dest) {
		ret = mpt_convertable_vlog(dest, fcn, type | logger::LogFunction, fmt, va);
	} else {
		ret = print_message(fcn, type, fmt, va);
	}
	if (fmt) va_end(va);
	return ret;
}